

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O2

void setptmode(global_State *g,GCproto *pt,int mode)

{
  if (((uint)mode >> 8 & 1) != 0) {
    pt->flags = pt->flags & 0xf7;
    lj_trace_reenableproto(pt);
    return;
  }
  if (((uint)mode >> 9 & 1) == 0) {
    pt->flags = pt->flags | 8;
    lj_trace_flushproto(g,pt);
    return;
  }
  while ((ulong)pt->trace != 0) {
    trace_flushroot((jit_State *)(g + 1),
                    (GCtrace *)(ulong)*(uint *)(g[1].wrapf + (ulong)pt->trace * 4));
  }
  return;
}

Assistant:

static void setptmode(global_State *g, GCproto *pt, int mode)
{
  if ((mode & LUAJIT_MODE_ON)) {  /* (Re-)enable JIT compilation. */
    pt->flags &= ~PROTO_NOJIT;
    lj_trace_reenableproto(pt);  /* Unpatch all ILOOP etc. bytecodes. */
  } else {  /* Flush and/or disable JIT compilation. */
    if (!(mode & LUAJIT_MODE_FLUSH))
      pt->flags |= PROTO_NOJIT;
    lj_trace_flushproto(g, pt);  /* Flush all traces of prototype. */
  }
}